

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vampire.cpp
# Opt level: O0

void axiomSelectionMode(Problem *problem)

{
  bool bVar1;
  Problem *this;
  UnitList **ppUVar2;
  Problem *in_RDI;
  Unit *u;
  Iterator uit;
  Normalisation norm;
  ScopedPtr<Kernel::Problem> prb;
  Unit *in_stack_00000198;
  Problem *in_stack_fffffffffffffe78;
  Problem *in_stack_fffffffffffffe80;
  Problem *in_stack_fffffffffffffe88;
  undefined7 in_stack_fffffffffffffe90;
  undefined1 in_stack_fffffffffffffe97;
  SineSelector *in_stack_fffffffffffffea0;
  Options *in_stack_fffffffffffffed8;
  SineSelector *in_stack_fffffffffffffee0;
  Iterator local_100 [30];
  ScopedPtr<Kernel::Problem> local_10 [2];
  
  Lib::ScopedPtr<Kernel::Problem>::ScopedPtr(local_10,in_RDI);
  Shell::Options::setSineSelection(Lib::env,AXIOMS);
  Lib::ScopedPtr<Kernel::Problem>::operator->(local_10);
  bVar1 = Kernel::Problem::hasFOOL(in_stack_fffffffffffffe80);
  if (bVar1) {
    FOOLElimination::FOOLElimination((FOOLElimination *)0x185865);
    Lib::ScopedPtr<Kernel::Problem>::operator*(local_10);
    FOOLElimination::apply((FOOLElimination *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
    FOOLElimination::~FOOLElimination((FOOLElimination *)0x18589c);
  }
  bVar1 = Shell::Options::normalize(Lib::env);
  if (bVar1) {
    *(undefined4 *)(DAT_01333840 + 600) = 3;
    Shell::Normalisation::Normalisation((Normalisation *)0x185921);
    Lib::ScopedPtr<Kernel::Problem>::operator*(local_10);
    Shell::Normalisation::normalise
              ((Normalisation *)CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90),
               in_stack_fffffffffffffe88);
    Shell::Normalisation::~Normalisation((Normalisation *)0x185958);
  }
  *(undefined4 *)(DAT_01333840 + 600) = 5;
  Shell::SineSelector::SineSelector(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  Lib::ScopedPtr<Kernel::Problem>::operator*(local_10);
  Shell::SineSelector::perform((SineSelector *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
  Shell::SineSelector::~SineSelector(in_stack_fffffffffffffea0);
  *(undefined4 *)(DAT_01333840 + 600) = 0x1c;
  this = Lib::ScopedPtr<Kernel::Problem>::operator->(local_10);
  ppUVar2 = Kernel::Problem::units(this);
  Lib::List<Kernel::Unit_*>::Iterator::Iterator(local_100,*ppUVar2);
  while (bVar1 = Lib::List<Kernel::Unit_*>::Iterator::hasNext((Iterator *)0x185a3c), bVar1) {
    Lib::List<Kernel::Unit_*>::Iterator::next((Iterator *)in_stack_fffffffffffffe80);
    Shell::TPTPPrinter::toString_abi_cxx11_(in_stack_00000198);
    in_stack_fffffffffffffe80 =
         (Problem *)std::operator<<((ostream *)&std::cout,(string *)&stack0xfffffffffffffed8);
    std::operator<<((ostream *)in_stack_fffffffffffffe80,"\n");
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffed8);
  }
  vampireReturnValue = 0;
  Lib::ScopedPtr<Kernel::Problem>::~ScopedPtr
            ((ScopedPtr<Kernel::Problem> *)in_stack_fffffffffffffe80);
  return;
}

Assistant:

void axiomSelectionMode(Problem* problem)
{
  ScopedPtr<Problem> prb(problem);

  env.options->setSineSelection(Options::SineSelection::AXIOMS);

  if (prb->hasFOOL()) {
    FOOLElimination().apply(*prb);
  }

  // reorder units
  if (env.options->normalize()) {
    env.statistics->phase = ExecutionPhase::NORMALIZATION;
    Normalisation norm;
    norm.normalise(*prb);
  }

  env.statistics->phase = ExecutionPhase::SINE_SELECTION;
  Shell::SineSelector(*env.options).perform(*prb);

  env.statistics->phase = ExecutionPhase::FINALIZATION;

  UnitList::Iterator uit(prb->units());
  while (uit.hasNext()) {
    Unit* u = uit.next();
    std::cout << TPTPPrinter::toString(u) << "\n";
  }

  //we have successfully output the selected units, so we'll terminate with zero return value
  vampireReturnValue = VAMP_RESULT_STATUS_SUCCESS;
}